

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_do(Curl_easy *data,_Bool *done)

{
  char *ptr;
  long lVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  int iVar6;
  size_t len;
  char *pcVar7;
  __off64_t _Var8;
  size_t len_00;
  curltime cVar9;
  curltime now;
  size_t local_218;
  int local_204;
  size_t local_1d8;
  size_t bytestoread;
  ssize_t nread;
  char local_1b8 [8];
  char accept_ranges [24];
  char local_198 [4];
  int headerlen;
  char header [80];
  tm *tm;
  tm buffer;
  time_t filetime;
  FILEPROTO *file;
  long lStack_e8;
  int fd;
  curl_off_t bytecount;
  char *buf;
  _Bool fstated;
  __dev_t _Stack_d0;
  _Bool size_known;
  curl_off_t expected_size;
  stat statbuf;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  statbuf.__glibc_reserved[2]._4_4_ = CURLE_OK;
  _Stack_d0 = 0xffffffffffffffff;
  bVar2 = false;
  ptr = (data->state).buffer;
  lStack_e8 = 0;
  *done = true;
  Curl_pgrsStartNow(data);
  if ((*(ulong *)&(data->set).field_0x8e2 >> 0x1a & 1) == 0) {
    iVar6 = ((data->req).p.file)->fd;
    iVar4 = fstat64(iVar6,(stat64 *)&expected_size);
    if (iVar4 != -1) {
      if (((uint)statbuf.st_nlink & 0xf000) != 0x4000) {
        _Stack_d0 = statbuf.st_rdev;
      }
      (data->info).filetime = statbuf.st_atim.tv_nsec;
      bVar2 = true;
    }
    if ((((!bVar2) || ((data->state).range != (char *)0x0)) || ((data->set).timecondition == '\0'))
       || (_Var3 = Curl_meets_timecondition(data,(data->info).filetime), _Var3)) {
      if (bVar2) {
        builtin_strncpy(local_1b8,"Accept-r",8);
        builtin_strncpy(accept_ranges,"anges: bytes\r\n",0xf);
        accept_ranges[0xf] = '\0';
        if (-1 < (long)_Stack_d0) {
          accept_ranges._20_4_ = curl_msnprintf(local_198,0x50,"Content-Length: %ld\r\n",_Stack_d0);
          statbuf.__glibc_reserved[2]._4_4_ =
               Curl_client_write(data,2,local_198,(long)(int)accept_ranges._20_4_);
          if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
            return statbuf.__glibc_reserved[2]._4_4_;
          }
          len = strlen(local_1b8);
          CVar5 = Curl_client_write(data,2,local_1b8,len);
          if (CVar5 != CURLE_OK) {
            return CVar5;
          }
          statbuf.__glibc_reserved[2]._4_4_ = CURLE_OK;
        }
        buffer.tm_zone = (char *)statbuf.st_atim.tv_nsec;
        statbuf.__glibc_reserved[2]._4_4_ = Curl_gmtime(statbuf.st_atim.tv_nsec,(tm *)&tm);
        if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
        if (buffer.tm_mon == 0) {
          local_204 = 6;
        }
        else {
          local_204 = buffer.tm_mon + -1;
        }
        pcVar7 = "\r\n";
        if ((*(ulong *)&(data->set).field_0x8e2 >> 0x19 & 1) != 0) {
          pcVar7 = "";
        }
        accept_ranges._20_4_ =
             curl_msnprintf(local_198,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s"
                            ,Curl_wkday[local_204],(ulong)(uint)buffer.tm_min,
                            Curl_month[buffer.tm_hour],buffer.tm_mday + 0x76c,buffer.tm_sec,tm._4_4_
                            ,tm._0_4_,pcVar7);
        statbuf.__glibc_reserved[2]._4_4_ =
             Curl_client_write(data,2,local_198,(long)(int)accept_ranges._20_4_);
        if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
        Curl_pgrsSetDownloadSize(data,_Stack_d0);
        if ((*(ulong *)&(data->set).field_0x8e2 >> 0x19 & 1) != 0) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
      }
      statbuf.__glibc_reserved[2]._4_4_ = Curl_range(data);
      data_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
      if (statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK) {
        if ((data->state).resume_from < 0) {
          if (!bVar2) {
            Curl_failf(data,"Can\'t get the size of file.");
            return CURLE_READ_ERROR;
          }
          (data->state).resume_from = statbuf.st_rdev + (data->state).resume_from;
        }
        if (0 < (data->state).resume_from) {
          if ((long)_Stack_d0 < (data->state).resume_from) {
            Curl_failf(data,"failed to resume file:// transfer");
            return CURLE_BAD_DOWNLOAD_RESUME;
          }
          _Stack_d0 = _Stack_d0 - (data->state).resume_from;
        }
        if (0 < (data->req).maxdownload) {
          _Stack_d0 = (data->req).maxdownload;
        }
        if ((bVar2) && (0 < (long)_Stack_d0)) {
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        if (bVar2) {
          Curl_pgrsSetDownloadSize(data,_Stack_d0);
        }
        if (((data->state).resume_from == 0) ||
           (lVar1 = (data->state).resume_from, _Var8 = lseek64(iVar6,(data->state).resume_from,0),
           lVar1 == _Var8)) {
          Curl_pgrsTime(data,TIMER_STARTTRANSFER);
          while (statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK) {
            if (bVar2) {
              if ((long)_Stack_d0 < (long)(ulong)(data->set).buffer_size) {
                local_218 = curlx_sotouz(_Stack_d0);
              }
              else {
                local_218 = (size_t)(data->set).buffer_size;
              }
              local_1d8 = local_218;
            }
            else {
              local_1d8 = (size_t)((data->set).buffer_size - 1);
            }
            len_00 = read(iVar6,ptr,local_1d8);
            if (((long)len_00 < 1) || ((ptr[len_00] = '\0', bVar2 && (_Stack_d0 == 0)))) break;
            lStack_e8 = len_00 + lStack_e8;
            if (bVar2) {
              _Stack_d0 = _Stack_d0 - len_00;
            }
            statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(data,1,ptr,len_00);
            if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
              return statbuf.__glibc_reserved[2]._4_4_;
            }
            Curl_pgrsSetDownloadCounter(data,lStack_e8);
            iVar4 = Curl_pgrsUpdate(data);
            if (iVar4 == 0) {
              cVar9 = Curl_now();
              now._12_4_ = 0;
              now.tv_sec = SUB128(cVar9._0_12_,0);
              now.tv_usec = SUB124(cVar9._0_12_,8);
              statbuf.__glibc_reserved[2]._4_4_ = Curl_speedcheck(data,now);
            }
            else {
              statbuf.__glibc_reserved[2]._4_4_ = CURLE_ABORTED_BY_CALLBACK;
            }
          }
          iVar6 = Curl_pgrsUpdate(data);
          if (iVar6 != 0) {
            statbuf.__glibc_reserved[2]._4_4_ = CURLE_ABORTED_BY_CALLBACK;
          }
          data_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
        }
        else {
          data_local._4_4_ = CURLE_BAD_DOWNLOAD_RESUME;
        }
      }
    }
    else {
      *done = true;
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    data_local._4_4_ = file_upload(data);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode file_do(struct Curl_easy *data, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = -1;
  bool size_known;
  bool fstated = FALSE;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(data);

  file = data->req.p.file;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    if(!S_ISDIR(statbuf.st_mode))
      expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  if(fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    int headerlen;
    char accept_ranges[24]= { "Accept-ranges: bytes\r\n" };
    if(expected_size >= 0) {
      headerlen = msnprintf(header, sizeof(header),
                "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n",
                expected_size);
      result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
      if(result)
        return result;

      result = Curl_client_write(data, CLIENTWRITE_HEADER,
                                 accept_ranges, strlen(accept_ranges));
      if(result != CURLE_OK)
        return result;
    }

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    headerlen = msnprintf(header, sizeof(header),
              "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
              Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
              tm->tm_mday,
              Curl_month[tm->tm_mon],
              tm->tm_year + 1900,
              tm->tm_hour,
              tm->tm_min,
              tm->tm_sec,
              data->set.opt_no_body ? "": "\r\n");
    result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
    if(result)
      return result;
    /* set the file size to make it available post transfer */
    Curl_pgrsSetDownloadSize(data, expected_size);
    if(data->set.opt_no_body)
      return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(data);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream if the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from > 0) {
    /* We check explicitly if we have a start offset, because
     * expected_size may be -1 if we don't know how large the file is,
     * in which case we should not adjust it. */
    if(data->state.resume_from <= expected_size)
      expected_size -= data->state.resume_from;
    else {
      failf(data, "failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size <= 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(size_known)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    ssize_t nread;
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(data, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}